

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.h
# Opt level: O0

AlignedVector<float> * __thiscall
intgemm::AlignedVector<float>::operator=(AlignedVector<float> *this,AlignedVector<float> *from)

{
  AlignedVector<float> *in_RSI;
  AlignedVector<float> *in_RDI;
  
  if (in_RDI != in_RSI) {
    release((AlignedVector<float> *)0x1a5c65);
    in_RDI->mem_ = in_RSI->mem_;
    in_RDI->size_ = in_RSI->size_;
    in_RSI->mem_ = (float *)0x0;
    in_RSI->size_ = 0;
  }
  return in_RDI;
}

Assistant:

AlignedVector &operator=(AlignedVector &&from) {
      if (this == &from) return *this;
      release();
      mem_ = from.mem_;
      size_ = from.size_;
      from.mem_ = nullptr;
      from.size_ = 0;
      return *this;
    }